

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CGL::Application::load(Application *this,SceneInfo *sceneInfo)

{
  Type TVar1;
  pointer pNVar2;
  LightInfo *light;
  undefined1 auVar3 [16];
  Vector3D VVar4;
  Vector3D VVar5;
  Application *pAVar6;
  Scene *this_00;
  Matrix4x4 *extraout_RDX;
  Matrix4x4 *extraout_RDX_00;
  Matrix4x4 *pMVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> objects;
  vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> lights;
  double dVar15;
  undefined8 uVar16;
  double dVar17;
  double dVar18;
  undefined1 local_1c8 [8];
  SceneObject **ppSStack_1c0;
  VisualDebugger *local_1b8;
  Scene *local_1a8;
  OfflineRenderer *pOStack_1a0;
  undefined1 local_198 [8];
  SceneLight **ppSStack_190;
  VisualDebugger *local_188;
  double local_180;
  Scene *local_178;
  Application *local_170;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_168;
  double local_148;
  double dStack_140;
  double local_138;
  undefined1 local_128 [16];
  double local_118;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_108;
  double local_e0;
  double local_d8;
  double dStack_d0;
  vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> local_c8;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> local_b0;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  Vector4D local_58;
  
  local_198 = (undefined1  [8])0x0;
  ppSStack_190 = (SceneLight **)0x0;
  local_188 = (VisualDebugger *)0x0;
  local_1b8 = (VisualDebugger *)0x0;
  local_1a8 = (Scene *)0x0;
  pOStack_1a0 = (OfflineRenderer *)0x0;
  local_1c8 = (undefined1  [8])0x0;
  ppSStack_1c0 = (SceneObject **)0x0;
  uVar9 = (int)((long)(sceneInfo->nodes).
                      super__Vector_base<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(sceneInfo->nodes).
                      super__Vector_base<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3b13b13b;
  local_170 = this;
  if ((int)uVar9 < 1) {
    dVar17 = 0.0;
    dVar15 = 0.0;
    dVar18 = 0.0;
  }
  else {
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    lVar8 = 0x50;
    uVar16 = 0.0;
    dVar18 = 0.0;
    dVar15 = 0.0;
    dVar17 = 0.0;
    do {
      pNVar2 = (sceneInfo->nodes).
               super__Vector_base<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      light = *(LightInfo **)((long)(pNVar2->transform).entries + lVar8 + 0xffffffffffffffa0U);
      TVar1 = (light->super_Instance).type;
      if (TVar1 < MATERIAL) {
        pMVar7 = (Matrix4x4 *)((long)(pNVar2->transform).entries + lVar8 + -0x50);
        switch(TVar1) {
        case CAMERA:
          local_108.field_0.x = (double)local_1a8;
          local_108.field_0.y = (double)pOStack_1a0;
          local_108.field_0.w = 1.0;
          local_108.field_0.z = (double)uVar16;
          Matrix4x4::operator*(pMVar7,(Vector4D *)&local_108.field_0);
          Vector4D::to3D(&local_58);
          local_1a8 = (Scene *)local_168.field_0.x;
          pOStack_1a0 = (OfflineRenderer *)local_168.field_0.y;
          local_108.field_0.x = (light->spectrum).field_0.field_0.x;
          local_108.field_0.y = (light->spectrum).field_0.field_0.y;
          local_108.field_0.z = (light->spectrum).field_0.field_0.z;
          local_108.field_0.w = 1.0;
          uVar16 = local_168.field_0.z;
          Matrix4x4::operator*(pMVar7,(Vector4D *)&local_108.field_0);
          Vector4D::to3D(&local_58);
          auVar3._8_8_ = local_168.field_0.y;
          auVar3._0_8_ = local_168.field_0.x;
          auVar3 = vdppd_avx(auVar3,auVar3,0x31);
          dVar18 = local_168.field_0.z * local_168.field_0.z + auVar3._0_8_;
          if (dVar18 < 0.0) {
            dVar17 = sqrt(dVar18);
            pMVar7 = extraout_RDX_00;
          }
          else {
            auVar12._8_8_ = 0;
            auVar12._0_8_ = dVar18;
            auVar3 = vsqrtsd_avx(auVar12,auVar12);
            dVar17 = auVar3._0_8_;
            pMVar7 = extraout_RDX;
          }
          dVar17 = 1.0 / dVar17;
          dVar18 = dVar17 * local_168.field_0.x;
          dVar15 = dVar17 * local_168.field_0.y;
          dVar17 = dVar17 * local_168.field_0.z;
          this = local_170;
          init_camera(local_170,(CameraInfo *)light,pMVar7);
          break;
        case LIGHT:
          local_168.field_0.x = (double)init_light(this,light,pMVar7);
          if ((VisualDebugger *)ppSStack_190 == local_188) {
            this = (Application *)local_198;
            std::vector<CGL::GLScene::SceneLight*,std::allocator<CGL::GLScene::SceneLight*>>::
            _M_realloc_insert<CGL::GLScene::SceneLight*>
                      ((vector<CGL::GLScene::SceneLight*,std::allocator<CGL::GLScene::SceneLight*>>
                        *)this,(iterator)ppSStack_190,(SceneLight **)&local_168);
          }
          else {
            *ppSStack_190 = (SceneLight *)local_168.field_0.x;
            ppSStack_190 = ppSStack_190 + 1;
          }
          break;
        case SPHERE:
          local_168.field_0.x = (double)init_sphere(this,(SphereInfo *)light,pMVar7);
          if ((VisualDebugger *)ppSStack_1c0 == local_1b8) {
            this = (Application *)local_1c8;
            std::vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>>::
            _M_realloc_insert<CGL::GLScene::SceneObject*>
                      ((vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>>
                        *)this,(iterator)ppSStack_1c0,(SceneObject **)&local_168);
          }
          else {
LAB_0013508e:
            *ppSStack_1c0 = (SceneObject *)local_168.field_0.x;
            ppSStack_1c0 = ppSStack_1c0 + 1;
          }
          break;
        case POLYMESH:
          local_168.field_0.x = (double)init_polymesh(this,(PolymeshInfo *)light,pMVar7);
          if ((VisualDebugger *)ppSStack_1c0 != local_1b8) goto LAB_0013508e;
          this = (Application *)local_1c8;
          std::vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>>::
          _M_realloc_insert<CGL::GLScene::SceneObject*>
                    ((vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>>
                      *)this,(iterator)ppSStack_1c0,(SceneObject **)&local_168);
        }
      }
      lVar8 = lVar8 + 0xd0;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  this_00 = (Scene *)operator_new(0x50);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::vector
            (&local_b0,
             (vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             local_1c8);
  pAVar6 = local_170;
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::vector
            (&local_c8,
             (vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             local_198);
  GLScene::Scene::Scene(this_00,&local_b0,&local_c8);
  pAVar6->scene = this_00;
  if (local_c8.
      super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.
      super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  GLScene::Scene::get_bbox((BBox *)&local_168.field_0,pAVar6->scene);
  if (((local_148 <= local_168.field_0.x) && (dStack_140 <= local_168.field_0.y)) &&
     (local_138 <= local_168.field_0.z)) {
    local_d8 = (local_148 + local_168.field_0.x) * 0.5;
    dStack_d0 = (dStack_140 + local_168.field_0.y) * 0.5;
    auVar3 = vdppd_avx(local_128,local_128,0x31);
    local_180 = (local_138 + local_168.field_0.z) * 0.5;
    dVar11 = local_118 * local_118 + auVar3._0_8_;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar11;
      auVar3 = vsqrtsd_avx(auVar13,auVar13);
      dVar11 = auVar3._0_8_;
    }
    dVar11 = dVar11 * 0.5 * 1.5;
    pAVar6->canonical_view_distance = dVar11;
    local_1a8 = (Scene *)(dVar11 + dVar11);
    dVar14 = dVar11 / 10.0;
    local_178 = (Scene *)(dVar11 * 20.0);
    local_78 = local_d8;
    dStack_70 = dStack_d0;
    local_68 = local_180;
    local_e0 = acos(dVar15);
    dVar11 = atan2(dVar18,dVar17);
    VVar4.field_0.field_0.y = dVar14;
    VVar4.field_0.field_0.x = dVar15;
    VVar4.field_0.field_0.z = dVar17;
    VVar4.field_0._24_8_ = dVar18;
    CGL::Camera::place(VVar4,local_e0,dVar11,(double)local_1a8,dVar14,(double)local_178);
    local_98 = local_d8;
    dStack_90 = dStack_d0;
    local_88 = local_180;
    dVar15 = acos(dVar15);
    dVar11 = atan2(dVar18,dVar17);
    VVar5.field_0.field_0.y = dVar14;
    VVar5.field_0.field_0.x = dVar15;
    VVar5.field_0.field_0.z = dVar17;
    VVar5.field_0._24_8_ = dVar18;
    CGL::Camera::place(VVar5,dVar15,dVar11,(double)local_1a8,dVar14,(double)local_178);
    pAVar6->scroll_rate = pAVar6->canonical_view_distance / 10.0;
  }
  GLScene::Scene::set_draw_styles
            (pAVar6->scene,&pAVar6->defaultStyle,&pAVar6->hoverStyle,&pAVar6->selectStyle);
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8);
  }
  if (local_198 != (undefined1  [8])0x0) {
    operator_delete((void *)local_198);
  }
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

  vector<Collada::Node>& nodes = sceneInfo->nodes;
  vector<GLScene::SceneLight *> lights;
  vector<GLScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node& node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4& transform = node.transform;

    switch(instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo*>(instance);
        c_pos = (transform * Vector4D(c_pos,1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir,1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT:
      {
        lights.push_back(
          init_light(static_cast<LightInfo&>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
          init_sphere(static_cast<SphereInfo&>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
          init_polymesh(static_cast<PolymeshInfo&>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo&>(*instance));
        break;
     }
  }

  scene = new GLScene::Scene(objects, lights);

  const BBox& bbox = scene->get_bbox();
  if (!bbox.empty()) {

    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target,
                          acos(c_dir.y),
                          atan2(c_dir.x, c_dir.z),
                          view_distance,
                          min_view_distance,
                          max_view_distance);

    camera.place(target,
                acos(c_dir.y),
                atan2(c_dir.x, c_dir.z),
                view_distance,
                min_view_distance,
                max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

}